

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitBinary(PrintExpressionContents *this,Binary *curr)

{
  char *pcVar1;
  
  prepareColor(this->o);
  switch(curr->op) {
  case AddInt32:
    pcVar1 = "i32.add";
    break;
  case SubInt32:
    pcVar1 = "i32.sub";
    break;
  case MulInt32:
    pcVar1 = "i32.mul";
    break;
  case DivSInt32:
    pcVar1 = "i32.div_s";
    break;
  case DivUInt32:
    pcVar1 = "i32.div_u";
    break;
  case RemSInt32:
    pcVar1 = "i32.rem_s";
    break;
  case RemUInt32:
    pcVar1 = "i32.rem_u";
    break;
  case AndInt32:
    pcVar1 = "i32.and";
    break;
  case OrInt32:
    pcVar1 = "i32.or";
    break;
  case XorInt32:
    pcVar1 = "i32.xor";
    break;
  case ShlInt32:
    pcVar1 = "i32.shl";
    break;
  case ShrSInt32:
    pcVar1 = "i32.shr_s";
    break;
  case ShrUInt32:
    pcVar1 = "i32.shr_u";
    break;
  case RotLInt32:
    pcVar1 = "i32.rotl";
    break;
  case RotRInt32:
    pcVar1 = "i32.rotr";
    break;
  case EqInt32:
    pcVar1 = "i32.eq";
    break;
  case NeInt32:
    pcVar1 = "i32.ne";
    break;
  case LtSInt32:
    pcVar1 = "i32.lt_s";
    break;
  case LtUInt32:
    pcVar1 = "i32.lt_u";
    break;
  case LeSInt32:
    pcVar1 = "i32.le_s";
    break;
  case LeUInt32:
    pcVar1 = "i32.le_u";
    break;
  case GtSInt32:
    pcVar1 = "i32.gt_s";
    break;
  case GtUInt32:
    pcVar1 = "i32.gt_u";
    break;
  case GeSInt32:
    pcVar1 = "i32.ge_s";
    break;
  case GeUInt32:
    pcVar1 = "i32.ge_u";
    break;
  case AddInt64:
    pcVar1 = "i64.add";
    break;
  case SubInt64:
    pcVar1 = "i64.sub";
    break;
  case MulInt64:
    pcVar1 = "i64.mul";
    break;
  case DivSInt64:
    pcVar1 = "i64.div_s";
    break;
  case DivUInt64:
    pcVar1 = "i64.div_u";
    break;
  case RemSInt64:
    pcVar1 = "i64.rem_s";
    break;
  case RemUInt64:
    pcVar1 = "i64.rem_u";
    break;
  case AndInt64:
    pcVar1 = "i64.and";
    break;
  case OrInt64:
    pcVar1 = "i64.or";
    break;
  case XorInt64:
    pcVar1 = "i64.xor";
    break;
  case ShlInt64:
    pcVar1 = "i64.shl";
    break;
  case ShrSInt64:
    pcVar1 = "i64.shr_s";
    break;
  case ShrUInt64:
    pcVar1 = "i64.shr_u";
    break;
  case RotLInt64:
    pcVar1 = "i64.rotl";
    break;
  case RotRInt64:
    pcVar1 = "i64.rotr";
    break;
  case EqInt64:
    pcVar1 = "i64.eq";
    break;
  case NeInt64:
    pcVar1 = "i64.ne";
    break;
  case LtSInt64:
    pcVar1 = "i64.lt_s";
    break;
  case LtUInt64:
    pcVar1 = "i64.lt_u";
    break;
  case LeSInt64:
    pcVar1 = "i64.le_s";
    break;
  case LeUInt64:
    pcVar1 = "i64.le_u";
    break;
  case GtSInt64:
    pcVar1 = "i64.gt_s";
    break;
  case GtUInt64:
    pcVar1 = "i64.gt_u";
    break;
  case GeSInt64:
    pcVar1 = "i64.ge_s";
    break;
  case GeUInt64:
    pcVar1 = "i64.ge_u";
    break;
  case AddFloat32:
    pcVar1 = "f32.add";
    break;
  case SubFloat32:
    pcVar1 = "f32.sub";
    break;
  case MulFloat32:
    pcVar1 = "f32.mul";
    break;
  case DivFloat32:
    pcVar1 = "f32.div";
    break;
  case CopySignFloat32:
    pcVar1 = "f32.copysign";
    break;
  case MinFloat32:
    pcVar1 = "f32.min";
    break;
  case MaxFloat32:
    pcVar1 = "f32.max";
    break;
  case EqFloat32:
    pcVar1 = "f32.eq";
    break;
  case NeFloat32:
    pcVar1 = "f32.ne";
    break;
  case LtFloat32:
    pcVar1 = "f32.lt";
    break;
  case LeFloat32:
    pcVar1 = "f32.le";
    break;
  case GtFloat32:
    pcVar1 = "f32.gt";
    break;
  case GeFloat32:
    pcVar1 = "f32.ge";
    break;
  case AddFloat64:
    pcVar1 = "f64.add";
    break;
  case SubFloat64:
    pcVar1 = "f64.sub";
    break;
  case MulFloat64:
    pcVar1 = "f64.mul";
    break;
  case DivFloat64:
    pcVar1 = "f64.div";
    break;
  case CopySignFloat64:
    pcVar1 = "f64.copysign";
    break;
  case MinFloat64:
    pcVar1 = "f64.min";
    break;
  case MaxFloat64:
    pcVar1 = "f64.max";
    break;
  case EqFloat64:
    pcVar1 = "f64.eq";
    break;
  case NeFloat64:
    pcVar1 = "f64.ne";
    break;
  case LtFloat64:
    pcVar1 = "f64.lt";
    break;
  case LeFloat64:
    pcVar1 = "f64.le";
    break;
  case GtFloat64:
    pcVar1 = "f64.gt";
    break;
  case GeFloat64:
    pcVar1 = "f64.ge";
    break;
  case EqVecI8x16:
    pcVar1 = "i8x16.eq";
    break;
  case NeVecI8x16:
    pcVar1 = "i8x16.ne";
    break;
  case LtSVecI8x16:
    pcVar1 = "i8x16.lt_s";
    break;
  case LtUVecI8x16:
    pcVar1 = "i8x16.lt_u";
    break;
  case GtSVecI8x16:
    pcVar1 = "i8x16.gt_s";
    break;
  case GtUVecI8x16:
    pcVar1 = "i8x16.gt_u";
    break;
  case LeSVecI8x16:
    pcVar1 = "i8x16.le_s";
    break;
  case LeUVecI8x16:
    pcVar1 = "i8x16.le_u";
    break;
  case GeSVecI8x16:
    pcVar1 = "i8x16.ge_s";
    break;
  case GeUVecI8x16:
    pcVar1 = "i8x16.ge_u";
    break;
  case EqVecI16x8:
    pcVar1 = "i16x8.eq";
    break;
  case NeVecI16x8:
    pcVar1 = "i16x8.ne";
    break;
  case LtSVecI16x8:
    pcVar1 = "i16x8.lt_s";
    break;
  case LtUVecI16x8:
    pcVar1 = "i16x8.lt_u";
    break;
  case GtSVecI16x8:
    pcVar1 = "i16x8.gt_s";
    break;
  case GtUVecI16x8:
    pcVar1 = "i16x8.gt_u";
    break;
  case LeSVecI16x8:
    pcVar1 = "i16x8.le_s";
    break;
  case LeUVecI16x8:
    pcVar1 = "i16x8.le_u";
    break;
  case GeSVecI16x8:
    pcVar1 = "i16x8.ge_s";
    break;
  case GeUVecI16x8:
    pcVar1 = "i16x8.ge_u";
    break;
  case EqVecI32x4:
    pcVar1 = "i32x4.eq";
    break;
  case NeVecI32x4:
    pcVar1 = "i32x4.ne";
    break;
  case LtSVecI32x4:
    pcVar1 = "i32x4.lt_s";
    break;
  case LtUVecI32x4:
    pcVar1 = "i32x4.lt_u";
    break;
  case GtSVecI32x4:
    pcVar1 = "i32x4.gt_s";
    break;
  case GtUVecI32x4:
    pcVar1 = "i32x4.gt_u";
    break;
  case LeSVecI32x4:
    pcVar1 = "i32x4.le_s";
    break;
  case LeUVecI32x4:
    pcVar1 = "i32x4.le_u";
    break;
  case GeSVecI32x4:
    pcVar1 = "i32x4.ge_s";
    break;
  case GeUVecI32x4:
    pcVar1 = "i32x4.ge_u";
    break;
  case EqVecI64x2:
    pcVar1 = "i64x2.eq";
    break;
  case NeVecI64x2:
    pcVar1 = "i64x2.ne";
    break;
  case LtSVecI64x2:
    pcVar1 = "i64x2.lt_s";
    break;
  case GtSVecI64x2:
    pcVar1 = "i64x2.gt_s";
    break;
  case LeSVecI64x2:
    pcVar1 = "i64x2.le_s";
    break;
  case GeSVecI64x2:
    pcVar1 = "i64x2.ge_s";
    break;
  case EqVecF16x8:
    pcVar1 = "f16x8.eq";
    break;
  case NeVecF16x8:
    pcVar1 = "f16x8.ne";
    break;
  case LtVecF16x8:
    pcVar1 = "f16x8.lt";
    break;
  case GtVecF16x8:
    pcVar1 = "f16x8.gt";
    break;
  case LeVecF16x8:
    pcVar1 = "f16x8.le";
    break;
  case GeVecF16x8:
    pcVar1 = "f16x8.ge";
    break;
  case EqVecF32x4:
    pcVar1 = "f32x4.eq";
    break;
  case NeVecF32x4:
    pcVar1 = "f32x4.ne";
    break;
  case LtVecF32x4:
    pcVar1 = "f32x4.lt";
    break;
  case GtVecF32x4:
    pcVar1 = "f32x4.gt";
    break;
  case LeVecF32x4:
    pcVar1 = "f32x4.le";
    break;
  case GeVecF32x4:
    pcVar1 = "f32x4.ge";
    break;
  case EqVecF64x2:
    pcVar1 = "f64x2.eq";
    break;
  case NeVecF64x2:
    pcVar1 = "f64x2.ne";
    break;
  case LtVecF64x2:
    pcVar1 = "f64x2.lt";
    break;
  case GtVecF64x2:
    pcVar1 = "f64x2.gt";
    break;
  case LeVecF64x2:
    pcVar1 = "f64x2.le";
    break;
  case GeVecF64x2:
    pcVar1 = "f64x2.ge";
    break;
  case AndVec128:
    pcVar1 = "v128.and";
    break;
  case OrVec128:
    pcVar1 = "v128.or";
    break;
  case XorVec128:
    pcVar1 = "v128.xor";
    break;
  case AndNotVec128:
    pcVar1 = "v128.andnot";
    break;
  case AddVecI8x16:
    pcVar1 = "i8x16.add";
    break;
  case AddSatSVecI8x16:
    pcVar1 = "i8x16.add_sat_s";
    break;
  case AddSatUVecI8x16:
    pcVar1 = "i8x16.add_sat_u";
    break;
  case SubVecI8x16:
    pcVar1 = "i8x16.sub";
    break;
  case SubSatSVecI8x16:
    pcVar1 = "i8x16.sub_sat_s";
    break;
  case SubSatUVecI8x16:
    pcVar1 = "i8x16.sub_sat_u";
    break;
  case MinSVecI8x16:
    pcVar1 = "i8x16.min_s";
    break;
  case MinUVecI8x16:
    pcVar1 = "i8x16.min_u";
    break;
  case MaxSVecI8x16:
    pcVar1 = "i8x16.max_s";
    break;
  case MaxUVecI8x16:
    pcVar1 = "i8x16.max_u";
    break;
  case AvgrUVecI8x16:
    pcVar1 = "i8x16.avgr_u";
    break;
  case AddVecI16x8:
    pcVar1 = "i16x8.add";
    break;
  case AddSatSVecI16x8:
    pcVar1 = "i16x8.add_sat_s";
    break;
  case AddSatUVecI16x8:
    pcVar1 = "i16x8.add_sat_u";
    break;
  case SubVecI16x8:
    pcVar1 = "i16x8.sub";
    break;
  case SubSatSVecI16x8:
    pcVar1 = "i16x8.sub_sat_s";
    break;
  case SubSatUVecI16x8:
    pcVar1 = "i16x8.sub_sat_u";
    break;
  case MulVecI16x8:
    pcVar1 = "i16x8.mul";
    break;
  case MinSVecI16x8:
    pcVar1 = "i16x8.min_s";
    break;
  case MinUVecI16x8:
    pcVar1 = "i16x8.min_u";
    break;
  case MaxSVecI16x8:
    pcVar1 = "i16x8.max_s";
    break;
  case MaxUVecI16x8:
    pcVar1 = "i16x8.max_u";
    break;
  case AvgrUVecI16x8:
    pcVar1 = "i16x8.avgr_u";
    break;
  case Q15MulrSatSVecI16x8:
    pcVar1 = "i16x8.q15mulr_sat_s";
    break;
  case ExtMulLowSVecI16x8:
    pcVar1 = "i16x8.extmul_low_i8x16_s";
    break;
  case ExtMulHighSVecI16x8:
    pcVar1 = "i16x8.extmul_high_i8x16_s";
    break;
  case ExtMulLowUVecI16x8:
    pcVar1 = "i16x8.extmul_low_i8x16_u";
    break;
  case ExtMulHighUVecI16x8:
    pcVar1 = "i16x8.extmul_high_i8x16_u";
    break;
  case AddVecI32x4:
    pcVar1 = "i32x4.add";
    break;
  case SubVecI32x4:
    pcVar1 = "i32x4.sub";
    break;
  case MulVecI32x4:
    pcVar1 = "i32x4.mul";
    break;
  case MinSVecI32x4:
    pcVar1 = "i32x4.min_s";
    break;
  case MinUVecI32x4:
    pcVar1 = "i32x4.min_u";
    break;
  case MaxSVecI32x4:
    pcVar1 = "i32x4.max_s";
    break;
  case MaxUVecI32x4:
    pcVar1 = "i32x4.max_u";
    break;
  case DotSVecI16x8ToVecI32x4:
    pcVar1 = "i32x4.dot_i16x8_s";
    break;
  case ExtMulLowSVecI32x4:
    pcVar1 = "i32x4.extmul_low_i16x8_s";
    break;
  case ExtMulHighSVecI32x4:
    pcVar1 = "i32x4.extmul_high_i16x8_s";
    break;
  case ExtMulLowUVecI32x4:
    pcVar1 = "i32x4.extmul_low_i16x8_u";
    break;
  case ExtMulHighUVecI32x4:
    pcVar1 = "i32x4.extmul_high_i16x8_u";
    break;
  case AddVecI64x2:
    pcVar1 = "i64x2.add";
    break;
  case SubVecI64x2:
    pcVar1 = "i64x2.sub";
    break;
  case MulVecI64x2:
    pcVar1 = "i64x2.mul";
    break;
  case ExtMulLowSVecI64x2:
    pcVar1 = "i64x2.extmul_low_i32x4_s";
    break;
  case ExtMulHighSVecI64x2:
    pcVar1 = "i64x2.extmul_high_i32x4_s";
    break;
  case ExtMulLowUVecI64x2:
    pcVar1 = "i64x2.extmul_low_i32x4_u";
    break;
  case ExtMulHighUVecI64x2:
    pcVar1 = "i64x2.extmul_high_i32x4_u";
    break;
  case AddVecF16x8:
    pcVar1 = "f16x8.add";
    break;
  case SubVecF16x8:
    pcVar1 = "f16x8.sub";
    break;
  case MulVecF16x8:
    pcVar1 = "f16x8.mul";
    break;
  case DivVecF16x8:
    pcVar1 = "f16x8.div";
    break;
  case MinVecF16x8:
    pcVar1 = "f16x8.min";
    break;
  case MaxVecF16x8:
    pcVar1 = "f16x8.max";
    break;
  case PMinVecF16x8:
    pcVar1 = "f16x8.pmin";
    break;
  case PMaxVecF16x8:
    pcVar1 = "f16x8.pmax";
    break;
  case AddVecF32x4:
    pcVar1 = "f32x4.add";
    break;
  case SubVecF32x4:
    pcVar1 = "f32x4.sub";
    break;
  case MulVecF32x4:
    pcVar1 = "f32x4.mul";
    break;
  case DivVecF32x4:
    pcVar1 = "f32x4.div";
    break;
  case MinVecF32x4:
    pcVar1 = "f32x4.min";
    break;
  case MaxVecF32x4:
    pcVar1 = "f32x4.max";
    break;
  case PMinVecF32x4:
    pcVar1 = "f32x4.pmin";
    break;
  case PMaxVecF32x4:
    pcVar1 = "f32x4.pmax";
    break;
  case AddVecF64x2:
    pcVar1 = "f64x2.add";
    break;
  case SubVecF64x2:
    pcVar1 = "f64x2.sub";
    break;
  case MulVecF64x2:
    pcVar1 = "f64x2.mul";
    break;
  case DivVecF64x2:
    pcVar1 = "f64x2.div";
    break;
  case MinVecF64x2:
    pcVar1 = "f64x2.min";
    break;
  case MaxVecF64x2:
    pcVar1 = "f64x2.max";
    break;
  case PMinVecF64x2:
    pcVar1 = "f64x2.pmin";
    break;
  case PMaxVecF64x2:
    pcVar1 = "f64x2.pmax";
    break;
  case NarrowSVecI16x8ToVecI8x16:
    pcVar1 = "i8x16.narrow_i16x8_s";
    break;
  case NarrowUVecI16x8ToVecI8x16:
    pcVar1 = "i8x16.narrow_i16x8_u";
    break;
  case NarrowSVecI32x4ToVecI16x8:
    pcVar1 = "i16x8.narrow_i32x4_s";
    break;
  case NarrowUVecI32x4ToVecI16x8:
    pcVar1 = "i16x8.narrow_i32x4_u";
    break;
  case SwizzleVecI8x16:
    pcVar1 = "i8x16.swizzle";
    break;
  case RelaxedSwizzleVecI8x16:
    pcVar1 = "i8x16.relaxed_swizzle";
    break;
  case RelaxedMinVecF32x4:
    pcVar1 = "f32x4.relaxed_min";
    break;
  case RelaxedMaxVecF32x4:
    pcVar1 = "f32x4.relaxed_max";
    break;
  case RelaxedMinVecF64x2:
    pcVar1 = "f64x2.relaxed_min";
    break;
  case RelaxedMaxVecF64x2:
    pcVar1 = "f64x2.relaxed_max";
    break;
  case RelaxedQ15MulrSVecI16x8:
    pcVar1 = "i16x8.relaxed_q15mulr_s";
    break;
  case DotI8x16I7x16SToVecI16x8:
    pcVar1 = "i16x8.dot_i8x16_i7x16_s";
    break;
  case InvalidBinary:
    handle_unreachable("unvalid binary operator",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x844);
  default:
    goto switchD_00b200a0_default;
  }
  std::operator<<(this->o,pcVar1);
switchD_00b200a0_default:
  Colors::normal(this->o);
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case AddInt32:
        o << "i32.add";
        break;
      case SubInt32:
        o << "i32.sub";
        break;
      case MulInt32:
        o << "i32.mul";
        break;
      case DivSInt32:
        o << "i32.div_s";
        break;
      case DivUInt32:
        o << "i32.div_u";
        break;
      case RemSInt32:
        o << "i32.rem_s";
        break;
      case RemUInt32:
        o << "i32.rem_u";
        break;
      case AndInt32:
        o << "i32.and";
        break;
      case OrInt32:
        o << "i32.or";
        break;
      case XorInt32:
        o << "i32.xor";
        break;
      case ShlInt32:
        o << "i32.shl";
        break;
      case ShrUInt32:
        o << "i32.shr_u";
        break;
      case ShrSInt32:
        o << "i32.shr_s";
        break;
      case RotLInt32:
        o << "i32.rotl";
        break;
      case RotRInt32:
        o << "i32.rotr";
        break;
      case EqInt32:
        o << "i32.eq";
        break;
      case NeInt32:
        o << "i32.ne";
        break;
      case LtSInt32:
        o << "i32.lt_s";
        break;
      case LtUInt32:
        o << "i32.lt_u";
        break;
      case LeSInt32:
        o << "i32.le_s";
        break;
      case LeUInt32:
        o << "i32.le_u";
        break;
      case GtSInt32:
        o << "i32.gt_s";
        break;
      case GtUInt32:
        o << "i32.gt_u";
        break;
      case GeSInt32:
        o << "i32.ge_s";
        break;
      case GeUInt32:
        o << "i32.ge_u";
        break;

      case AddInt64:
        o << "i64.add";
        break;
      case SubInt64:
        o << "i64.sub";
        break;
      case MulInt64:
        o << "i64.mul";
        break;
      case DivSInt64:
        o << "i64.div_s";
        break;
      case DivUInt64:
        o << "i64.div_u";
        break;
      case RemSInt64:
        o << "i64.rem_s";
        break;
      case RemUInt64:
        o << "i64.rem_u";
        break;
      case AndInt64:
        o << "i64.and";
        break;
      case OrInt64:
        o << "i64.or";
        break;
      case XorInt64:
        o << "i64.xor";
        break;
      case ShlInt64:
        o << "i64.shl";
        break;
      case ShrUInt64:
        o << "i64.shr_u";
        break;
      case ShrSInt64:
        o << "i64.shr_s";
        break;
      case RotLInt64:
        o << "i64.rotl";
        break;
      case RotRInt64:
        o << "i64.rotr";
        break;
      case EqInt64:
        o << "i64.eq";
        break;
      case NeInt64:
        o << "i64.ne";
        break;
      case LtSInt64:
        o << "i64.lt_s";
        break;
      case LtUInt64:
        o << "i64.lt_u";
        break;
      case LeSInt64:
        o << "i64.le_s";
        break;
      case LeUInt64:
        o << "i64.le_u";
        break;
      case GtSInt64:
        o << "i64.gt_s";
        break;
      case GtUInt64:
        o << "i64.gt_u";
        break;
      case GeSInt64:
        o << "i64.ge_s";
        break;
      case GeUInt64:
        o << "i64.ge_u";
        break;

      case AddFloat32:
        o << "f32.add";
        break;
      case SubFloat32:
        o << "f32.sub";
        break;
      case MulFloat32:
        o << "f32.mul";
        break;
      case DivFloat32:
        o << "f32.div";
        break;
      case CopySignFloat32:
        o << "f32.copysign";
        break;
      case MinFloat32:
        o << "f32.min";
        break;
      case MaxFloat32:
        o << "f32.max";
        break;
      case EqFloat32:
        o << "f32.eq";
        break;
      case NeFloat32:
        o << "f32.ne";
        break;
      case LtFloat32:
        o << "f32.lt";
        break;
      case LeFloat32:
        o << "f32.le";
        break;
      case GtFloat32:
        o << "f32.gt";
        break;
      case GeFloat32:
        o << "f32.ge";
        break;

      case AddFloat64:
        o << "f64.add";
        break;
      case SubFloat64:
        o << "f64.sub";
        break;
      case MulFloat64:
        o << "f64.mul";
        break;
      case DivFloat64:
        o << "f64.div";
        break;
      case CopySignFloat64:
        o << "f64.copysign";
        break;
      case MinFloat64:
        o << "f64.min";
        break;
      case MaxFloat64:
        o << "f64.max";
        break;
      case EqFloat64:
        o << "f64.eq";
        break;
      case NeFloat64:
        o << "f64.ne";
        break;
      case LtFloat64:
        o << "f64.lt";
        break;
      case LeFloat64:
        o << "f64.le";
        break;
      case GtFloat64:
        o << "f64.gt";
        break;
      case GeFloat64:
        o << "f64.ge";
        break;

      case EqVecI8x16:
        o << "i8x16.eq";
        break;
      case NeVecI8x16:
        o << "i8x16.ne";
        break;
      case LtSVecI8x16:
        o << "i8x16.lt_s";
        break;
      case LtUVecI8x16:
        o << "i8x16.lt_u";
        break;
      case GtSVecI8x16:
        o << "i8x16.gt_s";
        break;
      case GtUVecI8x16:
        o << "i8x16.gt_u";
        break;
      case LeSVecI8x16:
        o << "i8x16.le_s";
        break;
      case LeUVecI8x16:
        o << "i8x16.le_u";
        break;
      case GeSVecI8x16:
        o << "i8x16.ge_s";
        break;
      case GeUVecI8x16:
        o << "i8x16.ge_u";
        break;
      case EqVecI16x8:
        o << "i16x8.eq";
        break;
      case NeVecI16x8:
        o << "i16x8.ne";
        break;
      case LtSVecI16x8:
        o << "i16x8.lt_s";
        break;
      case LtUVecI16x8:
        o << "i16x8.lt_u";
        break;
      case GtSVecI16x8:
        o << "i16x8.gt_s";
        break;
      case GtUVecI16x8:
        o << "i16x8.gt_u";
        break;
      case LeSVecI16x8:
        o << "i16x8.le_s";
        break;
      case LeUVecI16x8:
        o << "i16x8.le_u";
        break;
      case GeSVecI16x8:
        o << "i16x8.ge_s";
        break;
      case GeUVecI16x8:
        o << "i16x8.ge_u";
        break;
      case EqVecI32x4:
        o << "i32x4.eq";
        break;
      case NeVecI32x4:
        o << "i32x4.ne";
        break;
      case LtSVecI32x4:
        o << "i32x4.lt_s";
        break;
      case LtUVecI32x4:
        o << "i32x4.lt_u";
        break;
      case GtSVecI32x4:
        o << "i32x4.gt_s";
        break;
      case GtUVecI32x4:
        o << "i32x4.gt_u";
        break;
      case LeSVecI32x4:
        o << "i32x4.le_s";
        break;
      case LeUVecI32x4:
        o << "i32x4.le_u";
        break;
      case GeSVecI32x4:
        o << "i32x4.ge_s";
        break;
      case GeUVecI32x4:
        o << "i32x4.ge_u";
        break;
      case EqVecI64x2:
        o << "i64x2.eq";
        break;
      case NeVecI64x2:
        o << "i64x2.ne";
        break;
      case LtSVecI64x2:
        o << "i64x2.lt_s";
        break;
      case GtSVecI64x2:
        o << "i64x2.gt_s";
        break;
      case LeSVecI64x2:
        o << "i64x2.le_s";
        break;
      case GeSVecI64x2:
        o << "i64x2.ge_s";
        break;
      case EqVecF16x8:
        o << "f16x8.eq";
        break;
      case NeVecF16x8:
        o << "f16x8.ne";
        break;
      case LtVecF16x8:
        o << "f16x8.lt";
        break;
      case GtVecF16x8:
        o << "f16x8.gt";
        break;
      case LeVecF16x8:
        o << "f16x8.le";
        break;
      case GeVecF16x8:
        o << "f16x8.ge";
        break;
      case EqVecF32x4:
        o << "f32x4.eq";
        break;
      case NeVecF32x4:
        o << "f32x4.ne";
        break;
      case LtVecF32x4:
        o << "f32x4.lt";
        break;
      case GtVecF32x4:
        o << "f32x4.gt";
        break;
      case LeVecF32x4:
        o << "f32x4.le";
        break;
      case GeVecF32x4:
        o << "f32x4.ge";
        break;
      case EqVecF64x2:
        o << "f64x2.eq";
        break;
      case NeVecF64x2:
        o << "f64x2.ne";
        break;
      case LtVecF64x2:
        o << "f64x2.lt";
        break;
      case GtVecF64x2:
        o << "f64x2.gt";
        break;
      case LeVecF64x2:
        o << "f64x2.le";
        break;
      case GeVecF64x2:
        o << "f64x2.ge";
        break;

      case AndVec128:
        o << "v128.and";
        break;
      case OrVec128:
        o << "v128.or";
        break;
      case XorVec128:
        o << "v128.xor";
        break;
      case AndNotVec128:
        o << "v128.andnot";
        break;

      case AddVecI8x16:
        o << "i8x16.add";
        break;
      case AddSatSVecI8x16:
        o << "i8x16.add_sat_s";
        break;
      case AddSatUVecI8x16:
        o << "i8x16.add_sat_u";
        break;
      case SubVecI8x16:
        o << "i8x16.sub";
        break;
      case SubSatSVecI8x16:
        o << "i8x16.sub_sat_s";
        break;
      case SubSatUVecI8x16:
        o << "i8x16.sub_sat_u";
        break;
      case MinSVecI8x16:
        o << "i8x16.min_s";
        break;
      case MinUVecI8x16:
        o << "i8x16.min_u";
        break;
      case MaxSVecI8x16:
        o << "i8x16.max_s";
        break;
      case MaxUVecI8x16:
        o << "i8x16.max_u";
        break;
      case AvgrUVecI8x16:
        o << "i8x16.avgr_u";
        break;
      case AddVecI16x8:
        o << "i16x8.add";
        break;
      case AddSatSVecI16x8:
        o << "i16x8.add_sat_s";
        break;
      case AddSatUVecI16x8:
        o << "i16x8.add_sat_u";
        break;
      case SubVecI16x8:
        o << "i16x8.sub";
        break;
      case SubSatSVecI16x8:
        o << "i16x8.sub_sat_s";
        break;
      case SubSatUVecI16x8:
        o << "i16x8.sub_sat_u";
        break;
      case MulVecI16x8:
        o << "i16x8.mul";
        break;
      case MinSVecI16x8:
        o << "i16x8.min_s";
        break;
      case MinUVecI16x8:
        o << "i16x8.min_u";
        break;
      case MaxSVecI16x8:
        o << "i16x8.max_s";
        break;
      case MaxUVecI16x8:
        o << "i16x8.max_u";
        break;
      case AvgrUVecI16x8:
        o << "i16x8.avgr_u";
        break;
      case Q15MulrSatSVecI16x8:
        o << "i16x8.q15mulr_sat_s";
        break;
      case ExtMulLowSVecI16x8:
        o << "i16x8.extmul_low_i8x16_s";
        break;
      case ExtMulHighSVecI16x8:
        o << "i16x8.extmul_high_i8x16_s";
        break;
      case ExtMulLowUVecI16x8:
        o << "i16x8.extmul_low_i8x16_u";
        break;
      case ExtMulHighUVecI16x8:
        o << "i16x8.extmul_high_i8x16_u";
        break;

      case AddVecI32x4:
        o << "i32x4.add";
        break;
      case SubVecI32x4:
        o << "i32x4.sub";
        break;
      case MulVecI32x4:
        o << "i32x4.mul";
        break;
      case MinSVecI32x4:
        o << "i32x4.min_s";
        break;
      case MinUVecI32x4:
        o << "i32x4.min_u";
        break;
      case MaxSVecI32x4:
        o << "i32x4.max_s";
        break;
      case MaxUVecI32x4:
        o << "i32x4.max_u";
        break;
      case DotSVecI16x8ToVecI32x4:
        o << "i32x4.dot_i16x8_s";
        break;
      case ExtMulLowSVecI32x4:
        o << "i32x4.extmul_low_i16x8_s";
        break;
      case ExtMulHighSVecI32x4:
        o << "i32x4.extmul_high_i16x8_s";
        break;
      case ExtMulLowUVecI32x4:
        o << "i32x4.extmul_low_i16x8_u";
        break;
      case ExtMulHighUVecI32x4:
        o << "i32x4.extmul_high_i16x8_u";
        break;

      case AddVecI64x2:
        o << "i64x2.add";
        break;
      case SubVecI64x2:
        o << "i64x2.sub";
        break;
      case MulVecI64x2:
        o << "i64x2.mul";
        break;
      case ExtMulLowSVecI64x2:
        o << "i64x2.extmul_low_i32x4_s";
        break;
      case ExtMulHighSVecI64x2:
        o << "i64x2.extmul_high_i32x4_s";
        break;
      case ExtMulLowUVecI64x2:
        o << "i64x2.extmul_low_i32x4_u";
        break;
      case ExtMulHighUVecI64x2:
        o << "i64x2.extmul_high_i32x4_u";
        break;

      case AddVecF16x8:
        o << "f16x8.add";
        break;
      case SubVecF16x8:
        o << "f16x8.sub";
        break;
      case MulVecF16x8:
        o << "f16x8.mul";
        break;
      case DivVecF16x8:
        o << "f16x8.div";
        break;
      case MinVecF16x8:
        o << "f16x8.min";
        break;
      case MaxVecF16x8:
        o << "f16x8.max";
        break;
      case PMinVecF16x8:
        o << "f16x8.pmin";
        break;
      case PMaxVecF16x8:
        o << "f16x8.pmax";
        break;

      case AddVecF32x4:
        o << "f32x4.add";
        break;
      case SubVecF32x4:
        o << "f32x4.sub";
        break;
      case MulVecF32x4:
        o << "f32x4.mul";
        break;
      case DivVecF32x4:
        o << "f32x4.div";
        break;
      case MinVecF32x4:
        o << "f32x4.min";
        break;
      case MaxVecF32x4:
        o << "f32x4.max";
        break;
      case PMinVecF32x4:
        o << "f32x4.pmin";
        break;
      case PMaxVecF32x4:
        o << "f32x4.pmax";
        break;
      case AddVecF64x2:
        o << "f64x2.add";
        break;
      case SubVecF64x2:
        o << "f64x2.sub";
        break;
      case MulVecF64x2:
        o << "f64x2.mul";
        break;
      case DivVecF64x2:
        o << "f64x2.div";
        break;
      case MinVecF64x2:
        o << "f64x2.min";
        break;
      case MaxVecF64x2:
        o << "f64x2.max";
        break;
      case PMinVecF64x2:
        o << "f64x2.pmin";
        break;
      case PMaxVecF64x2:
        o << "f64x2.pmax";
        break;

      case NarrowSVecI16x8ToVecI8x16:
        o << "i8x16.narrow_i16x8_s";
        break;
      case NarrowUVecI16x8ToVecI8x16:
        o << "i8x16.narrow_i16x8_u";
        break;
      case NarrowSVecI32x4ToVecI16x8:
        o << "i16x8.narrow_i32x4_s";
        break;
      case NarrowUVecI32x4ToVecI16x8:
        o << "i16x8.narrow_i32x4_u";
        break;

      case SwizzleVecI8x16:
        o << "i8x16.swizzle";
        break;

      case RelaxedMinVecF32x4:
        o << "f32x4.relaxed_min";
        break;
      case RelaxedMaxVecF32x4:
        o << "f32x4.relaxed_max";
        break;
      case RelaxedMinVecF64x2:
        o << "f64x2.relaxed_min";
        break;
      case RelaxedMaxVecF64x2:
        o << "f64x2.relaxed_max";
        break;
      case RelaxedSwizzleVecI8x16:
        o << "i8x16.relaxed_swizzle";
        break;
      case RelaxedQ15MulrSVecI16x8:
        o << "i16x8.relaxed_q15mulr_s";
        break;
      case DotI8x16I7x16SToVecI16x8:
        o << "i16x8.dot_i8x16_i7x16_s";
        break;

      case InvalidBinary:
        WASM_UNREACHABLE("unvalid binary operator");
    }
    restoreNormalColor(o);
  }